

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O1

bool wallet::DumpWallet(ArgsManager *args,WalletDatabase *db,bilingual_str *error)

{
  char *pcVar1;
  bool bVar2;
  long *plVar3;
  _List _Var4;
  char cVar5;
  int iVar6;
  string *strDefault;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> cursor;
  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> batch;
  string value_str;
  string format;
  HashWriter hasher;
  string line;
  string key_str;
  ofstream dump_file;
  path path;
  string dump_filename;
  long *local_3f8;
  long *local_3f0;
  string local_3e8;
  string local_3c8;
  undefined1 local_3a8 [8];
  pointer pbStack_3a0;
  pointer local_398;
  long lStack_390;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  uchar local_308 [40];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [24];
  code *local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [6];
  ios_base local_188 [264];
  undefined1 local_80 [32];
  _List local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_280._0_8_ = &local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"-dumpfile","");
  pcVar1 = local_348 + 0x10;
  local_348._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"");
  strDefault = (string *)local_348;
  ArgsManager::GetArg(&local_58,args,(string *)local_280,strDefault);
  if ((char *)local_348._0_8_ != pcVar1) {
    operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != &local_270) {
    operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
  }
  if (local_58._M_string_length == 0) {
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,
               "No dump file provided. To use dump, -dumpfile=<filename> must be provided.","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_260[0]._M_dataplus._M_p = (pointer)&local_260[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,
                 "No dump file provided. To use dump, -dumpfile=<filename> must be provided.","");
    }
    else {
      local_348._0_8_ = "No dump file provided. To use dump, -dumpfile=<filename> must be provided."
      ;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (local_260,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_348);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260[0]._M_dataplus._M_p != &local_260[0].field_2) {
      operator_delete(local_260[0]._M_dataplus._M_p,local_260[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
    }
    bVar7 = false;
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)local_280,&local_58,auto_format);
    std::filesystem::__cxx11::path::path((path *)local_80,(path *)local_280);
    std::filesystem::__cxx11::path::~path((path *)local_280);
    std::filesystem::absolute((path *)local_280);
    std::filesystem::__cxx11::path::path((path *)local_348,(path *)local_280);
    std::filesystem::__cxx11::path::~path((path *)local_280);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
    _Var4._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         local_60._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    local_60._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )local_328._M_dataplus;
    local_328._M_dataplus._M_p = (pointer)0x0;
    if (_Var4._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&local_60,
                 (_Impl *)_Var4._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear((path *)local_348);
    std::filesystem::__cxx11::path::~path((path *)local_348);
    cVar5 = std::filesystem::status((path *)local_80);
    if ((cVar5 == '\0') || (cVar5 == -1)) {
      std::ofstream::ofstream(local_280);
      std::ofstream::open(local_280,(_Ios_Openmode)local_80._0_8_);
      if ((*(byte *)((long)&local_260[0]._M_dataplus._M_p + *(long *)(local_280._0_8_ + -0x18)) & 5)
          == 0) {
        local_308[0x10] = '\0';
        local_308[0x11] = '\0';
        local_308[0x12] = '\0';
        local_308[0x13] = '\0';
        local_308[0x14] = '\0';
        local_308[0x15] = '\0';
        local_308[0x16] = '\0';
        local_308[0x17] = '\0';
        local_308[0x18] = '\0';
        local_308[0x19] = '\0';
        local_308[0x1a] = '\0';
        local_308[0x1b] = '\0';
        local_308[0x1c] = '\0';
        local_308[0x1d] = '\0';
        local_308[0x1e] = '\0';
        local_308[0x1f] = '\0';
        local_308[0] = '\0';
        local_308[1] = '\0';
        local_308[2] = '\0';
        local_308[3] = '\0';
        local_308[4] = '\0';
        local_308[5] = '\0';
        local_308[6] = '\0';
        local_308[7] = '\0';
        local_308[8] = '\0';
        local_308[9] = '\0';
        local_308[10] = '\0';
        local_308[0xb] = '\0';
        local_308[0xc] = '\0';
        local_308[0xd] = '\0';
        local_308[0xe] = '\0';
        local_308[0xf] = '\0';
        local_328.field_2._M_allocated_capacity = 0;
        local_328.field_2._M_local_buf[8] = '\0';
        local_328.field_2._M_local_buf[9] = '\0';
        local_328.field_2._M_local_buf[10] = '\0';
        local_328.field_2._M_local_buf[0xb] = '\0';
        local_328.field_2._M_local_buf[0xc] = '\0';
        local_328.field_2._M_local_buf[0xd] = '\0';
        local_328.field_2._M_local_buf[0xe] = '\0';
        local_328.field_2._M_local_buf[0xf] = '\0';
        local_328._M_dataplus._M_p = (pointer)0x0;
        local_328._M_string_length = 0;
        local_348._16_8_ = 0;
        local_348._24_8_ = 0;
        local_348._0_8_ = (char *)0x0;
        local_348._8_8_ = 0;
        local_308[0x20] = '\0';
        local_308[0x21] = '\0';
        local_308[0x22] = '\0';
        local_308[0x23] = '\0';
        local_308[0x24] = '\0';
        local_308[0x25] = '\0';
        local_308[0x26] = '\0';
        local_308[0x27] = '\0';
        CSHA256::CSHA256((CSHA256 *)local_348);
        (*db->_vptr_WalletDatabase[0xe])(&local_3f0,db,1);
        (**(code **)(*local_3f0 + 0x48))(&local_3f8);
        bVar7 = true;
        if (local_3f8 == (long *)0x0) {
          local_2c0._0_8_ = (FormatArg *)(local_2c0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2c0,"Error: Couldn\'t create cursor into database","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2a0,"Error: Couldn\'t create cursor into database","");
          }
          else {
            local_2e0._0_8_ = "Error: Couldn\'t create cursor into database";
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_2a0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_2e0);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->original,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0)
          ;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->translated,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          if ((FormatArg *)local_2c0._0_8_ != (FormatArg *)(local_2c0 + 0x10)) {
            operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
          }
          bVar7 = false;
        }
        tinyformat::format<std::__cxx11::string,unsigned_int>
                  ((string *)local_2e0,(tinyformat *)"%s,%u\n",(char *)&DUMP_MAGIC_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &DUMP_VERSION,(uint *)in_R8);
        std::ostream::write(local_280,local_2e0._0_8_);
        CSHA256::Write((CSHA256 *)local_348,(uchar *)local_2e0._0_8_,local_2e0._8_8_);
        (*db->_vptr_WalletDatabase[0xd])(&local_368,db);
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_368,"bdb_ro");
        if (iVar6 == 0) {
          in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_368,0,local_368._M_string_length,"bdb",3);
        }
        tinyformat::format<char[7],std::__cxx11::string>
                  ((string *)local_2c0,(tinyformat *)"%s,%s\n","format",(char (*) [7])&local_368,
                   in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
        if ((FormatArg *)local_2c0._0_8_ != (FormatArg *)(local_2c0 + 0x10)) {
          operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
        }
        std::ostream::write(local_280,local_2e0._0_8_);
        CSHA256::Write((CSHA256 *)local_348,(uchar *)local_2e0._0_8_,local_2e0._8_8_);
        if (bVar7) {
          do {
            local_388.field_2._M_allocated_capacity = 0;
            local_388.field_2._8_8_ = 0;
            local_388._M_dataplus._M_p = (pointer)0x0;
            local_388._M_string_length = 0;
            local_398 = (pointer)0x0;
            lStack_390 = 0;
            local_3a8 = (undefined1  [8])0x0;
            pbStack_3a0 = (pointer)0x0;
            iVar6 = (**(code **)(*local_3f8 + 0x10))
                              (local_3f8,&local_388,
                               (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                               local_3a8);
            if (iVar6 == 2) {
              bVar7 = true;
              bVar2 = false;
            }
            else if (iVar6 == 0) {
              local_2c0._0_8_ = local_2c0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2c0,"Error reading next record from wallet database","");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2a0,"Error reading next record from wallet database","")
                ;
              }
              else {
                local_3c8._M_dataplus._M_p = "Error reading next record from wallet database";
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          (&local_2a0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_3c8
                          );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&error->original,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2c0);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&error->translated,&local_2a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
              if ((FormatArg *)local_2c0._0_8_ != (FormatArg *)(local_2c0 + 0x10)) {
                operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
              }
              bVar2 = false;
              bVar7 = false;
            }
            else {
              s.m_data = (uchar *)(local_388._M_dataplus._M_p + local_388.field_2._8_8_);
              s.m_size = local_388._M_string_length - (long)s.m_data;
              HexStr_abi_cxx11_((string *)local_2c0,s);
              s_00.m_data = (pointer)((long)local_3a8 + lStack_390);
              s_00.m_size = (long)pbStack_3a0 - (long)s_00.m_data;
              HexStr_abi_cxx11_(&local_3c8,s_00);
              tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                        (&local_3e8,(tinyformat *)"%s,%s\n",local_2c0,&local_3c8,in_R8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2e0,&local_3e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p,
                                local_3e8.field_2._M_allocated_capacity + 1);
              }
              std::ostream::write(local_280,local_2e0._0_8_);
              CSHA256::Write((CSHA256 *)local_348,(uchar *)local_2e0._0_8_,local_2e0._8_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                operator_delete(local_3c8._M_dataplus._M_p,
                                local_3c8.field_2._M_allocated_capacity + 1);
              }
              if ((FormatArg *)local_2c0._0_8_ != (FormatArg *)(local_2c0 + 0x10)) {
                operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
              }
              bVar2 = true;
            }
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_3a8);
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_388)
            ;
          } while (bVar2);
        }
        plVar3 = local_3f8;
        local_3f8 = (long *)0x0;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
        plVar3 = local_3f0;
        local_3f0 = (long *)0x0;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x28))();
        }
        if (bVar7) {
          HashWriter::GetHash((uint256 *)local_3a8,(HashWriter *)local_348);
          s_01.m_size = 0x20;
          s_01.m_data = local_3a8;
          HexStr_abi_cxx11_(&local_388,s_01);
          local_2c0._0_8_ = local_2c0 + 0x10;
          local_2c0._8_4_ = 1;
          local_2a8 = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
          local_2a0._M_dataplus._M_p =
               (pointer)tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
          local_2c0._16_8_ = &local_388;
          tinyformat::detail::formatImpl
                    ((ostream *)local_280,"checksum,%s\n",(FormatArg *)local_2c0._0_8_,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
          }
          std::ofstream::close();
        }
        else {
          std::ofstream::close();
          std::filesystem::remove((path *)local_80);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
          operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
        }
        if (local_3f8 != (long *)0x0) {
          (**(code **)(*local_3f8 + 8))();
        }
        if (local_3f0 != (long *)0x0) {
          (**(code **)(*local_3f0 + 0x28))();
        }
      }
      else {
        local_2c0._0_8_ = (FormatArg *)(local_2c0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2c0,"Unable to open %s for writing","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a0,"Unable to open %s for writing","");
        }
        else {
          local_2e0._0_8_ = "Unable to open %s for writing";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_2a0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_2e0);
        }
        local_2e0._0_8_ = local_2e0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2e0,local_80._0_8_,(pointer)(local_80._0_8_ + local_80._8_8_));
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_348,(tinyformat *)local_2c0,(bilingual_str *)local_2e0,
                   strDefault);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_348._0_8_ != pcVar1) {
          operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
        }
        if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
          operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if ((FormatArg *)local_2c0._0_8_ != (FormatArg *)(local_2c0 + 0x10)) {
          operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
        }
        bVar7 = false;
      }
      local_280._0_8_ = _VTT;
      *(undefined8 *)(local_280 + *(long *)(_VTT->_M_local_buf + -0x18)) = _sqlite3_sql;
      std::filebuf::~filebuf((filebuf *)(local_280 + 8));
      std::ios_base::~ios_base(local_188);
    }
    else {
      local_348._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_348,
                 "File %s already exists. If you are sure this is what you want, move it out of the way first."
                 ,"");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_328,
                   "File %s already exists. If you are sure this is what you want, move it out of the way first."
                   ,"");
      }
      else {
        local_2c0._0_8_ =
             "File %s already exists. If you are sure this is what you want, move it out of the way first."
        ;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_328,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_2c0);
      }
      local_2c0._0_8_ = (FormatArg *)(local_2c0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c0,local_80._0_8_,(pointer)(local_80._0_8_ + local_80._8_8_));
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)local_280,(tinyformat *)local_348,(bilingual_str *)local_2c0,
                 strDefault);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260[0]._M_dataplus._M_p != &local_260[0].field_2) {
        operator_delete(local_260[0]._M_dataplus._M_p,local_260[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._0_8_ != &local_270) {
        operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
      }
      if ((FormatArg *)local_2c0._0_8_ != (FormatArg *)(local_2c0 + 0x10)) {
        operator_delete((void *)local_2c0._0_8_,(ulong)(local_2c0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_348._0_8_ != pcVar1) {
        operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
      }
      bVar7 = false;
    }
    std::filesystem::__cxx11::path::~path((path *)local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool DumpWallet(const ArgsManager& args, WalletDatabase& db, bilingual_str& error)
{
    // Get the dumpfile
    std::string dump_filename = args.GetArg("-dumpfile", "");
    if (dump_filename.empty()) {
        error = _("No dump file provided. To use dump, -dumpfile=<filename> must be provided.");
        return false;
    }

    fs::path path = fs::PathFromString(dump_filename);
    path = fs::absolute(path);
    if (fs::exists(path)) {
        error = strprintf(_("File %s already exists. If you are sure this is what you want, move it out of the way first."), fs::PathToString(path));
        return false;
    }
    std::ofstream dump_file;
    dump_file.open(path);
    if (dump_file.fail()) {
        error = strprintf(_("Unable to open %s for writing"), fs::PathToString(path));
        return false;
    }

    HashWriter hasher{};

    std::unique_ptr<DatabaseBatch> batch = db.MakeBatch();

    bool ret = true;
    std::unique_ptr<DatabaseCursor> cursor = batch->GetNewCursor();
    if (!cursor) {
        error = _("Error: Couldn't create cursor into database");
        ret = false;
    }

    // Write out a magic string with version
    std::string line = strprintf("%s,%u\n", DUMP_MAGIC, DUMP_VERSION);
    dump_file.write(line.data(), line.size());
    hasher << Span{line};

    // Write out the file format
    std::string format = db.Format();
    // BDB files that are opened using BerkeleyRODatabase have it's format as "bdb_ro"
    // We want to override that format back to "bdb"
    if (format == "bdb_ro") {
        format = "bdb";
    }
    line = strprintf("%s,%s\n", "format", format);
    dump_file.write(line.data(), line.size());
    hasher << Span{line};

    if (ret) {

        // Read the records
        while (true) {
            DataStream ss_key{};
            DataStream ss_value{};
            DatabaseCursor::Status status = cursor->Next(ss_key, ss_value);
            if (status == DatabaseCursor::Status::DONE) {
                ret = true;
                break;
            } else if (status == DatabaseCursor::Status::FAIL) {
                error = _("Error reading next record from wallet database");
                ret = false;
                break;
            }
            std::string key_str = HexStr(ss_key);
            std::string value_str = HexStr(ss_value);
            line = strprintf("%s,%s\n", key_str, value_str);
            dump_file.write(line.data(), line.size());
            hasher << Span{line};
        }
    }

    cursor.reset();
    batch.reset();

    if (ret) {
        // Write the hash
        tfm::format(dump_file, "checksum,%s\n", HexStr(hasher.GetHash()));
        dump_file.close();
    } else {
        // Remove the dumpfile on failure
        dump_file.close();
        fs::remove(path);
    }

    return ret;
}